

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O1

int count_spool(CHAR_DATA *ch,int type)

{
  bool bVar1;
  MYSQL_RES *pMVar2;
  MYSQL_ROW row;
  int iVar3;
  char query [4608];
  char acStack_1218 [4608];
  
  iVar3 = 0;
  sprintf(acStack_1218,"SELECT * FROM notes WHERE type=%d",type);
  pMVar2 = one_query_res(acStack_1218);
  row = (MYSQL_ROW)mysql_fetch_row(pMVar2);
  if (row != (MYSQL_ROW)0x0) {
    iVar3 = 0;
    do {
      bVar1 = hide_note(ch,row);
      iVar3 = iVar3 + (uint)!bVar1;
      row = (MYSQL_ROW)mysql_fetch_row(pMVar2);
    } while (row != (MYSQL_ROW)0x0);
  }
  mysql_free_result(pMVar2);
  return iVar3;
}

Assistant:

int count_spool(CHAR_DATA *ch, int type)
{
	int count = 0;
	MYSQL_RES *res;
	MYSQL_ROW row;
	char query[MSL];

	sprintf(query, "SELECT * FROM notes WHERE type=%d", type);
	res = one_query_res(query);

	while ((row = mysql_fetch_row(res)))
	{
		if (!hide_note(ch, row))
			count++;
	}

	mysql_free_result(res);
	return count;
}